

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<unsigned_short>_>::
UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
::Left(UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
       *this,idx_t begin,idx_t end)

{
  bool bVar1;
  ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_> *in_RDX;
  ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_> *in_RSI;
  idx_t in_RDI;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *unaff_retaddr;
  
  for (; in_RSI < in_RDX;
      in_RSI = (ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_>
                *)((long)&in_RSI->fmask + 1)) {
    bVar1 = ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_>
            ::operator()(in_RSI,(idx_t *)in_RDX);
    if (bVar1) {
      ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::ModeRm(unaff_retaddr,in_RDI)
      ;
    }
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}